

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int aec_decode_init(aec_stream_conflict *strm)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  int i;
  int iVar4;
  uint uVar5;
  internal_state_conflict *piVar6;
  code *pcVar7;
  _func_int_aec_stream_ptr_conflict **pp_Var8;
  ulong uVar9;
  uint32_t *puVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  
  uVar1 = strm->bits_per_sample;
  iVar13 = -1;
  if (0xffffffdf < uVar1 - 0x21) {
    iVar13 = 1;
    piVar6 = (internal_state_conflict *)calloc(1,0x358);
    if (piVar6 == (internal_state_conflict *)0x0) {
      iVar13 = -4;
    }
    else {
      iVar11 = 2;
      iVar12 = 1;
      iVar14 = 0;
      for (iVar4 = 0; iVar4 != 0xd; iVar4 = iVar4 + 1) {
        iVar15 = iVar13 + iVar14;
        for (lVar16 = (long)iVar14; iVar12 != lVar16; lVar16 = lVar16 + 1) {
          piVar6->se_table[lVar16 * 2] = iVar4;
          piVar6->se_table[lVar16 * 2 + 1] = iVar14;
        }
        iVar13 = iVar13 + 1;
        iVar12 = iVar12 + iVar11;
        iVar11 = iVar11 + 1;
        iVar14 = iVar15;
      }
      strm->state = piVar6;
      if (uVar1 < 0x11) {
        if (uVar1 < 9) {
          uVar17 = strm->flags;
          if ((uVar17 & 0x10) == 0) {
            piVar6->id_len = 3;
            iVar13 = 3;
          }
          else {
            if (4 < uVar1) {
              return -1;
            }
            if (uVar1 < 3) {
              piVar6->id_len = 1;
              iVar13 = 1;
            }
            else {
              piVar6->id_len = 2;
              iVar13 = 2;
            }
          }
          piVar6->bytes_per_sample = 1;
          uVar2 = strm->block_size;
          piVar6->out_blklen = uVar2;
          piVar6->flush_output = flush_8;
        }
        else {
          piVar6->bytes_per_sample = 2;
          piVar6->id_len = 4;
          uVar2 = strm->block_size;
          piVar6->out_blklen = uVar2 * 2;
          uVar17 = strm->flags;
          if ((uVar17 & 4) == 0) {
            pcVar7 = flush_lsb_16;
          }
          else {
            pcVar7 = flush_msb_16;
          }
          piVar6->flush_output = pcVar7;
          iVar13 = 4;
        }
      }
      else {
        piVar6->id_len = 5;
        uVar17 = strm->flags;
        if ((uVar17 & 2) == 0 || 0x18 < uVar1) {
          piVar6->bytes_per_sample = 4;
          pcVar7 = flush_msb_32;
          if ((uVar17 & 4) == 0) {
            pcVar7 = flush_lsb_32;
          }
          iVar13 = 4;
        }
        else {
          piVar6->bytes_per_sample = 3;
          pcVar7 = flush_msb_24;
          if ((uVar17 & 4) == 0) {
            pcVar7 = flush_lsb_24;
          }
          iVar13 = 3;
        }
        piVar6->flush_output = pcVar7;
        uVar2 = strm->block_size;
        piVar6->out_blklen = iVar13 * uVar2;
        iVar13 = 5;
      }
      uVar5 = (uint)(-1L << ((byte)uVar1 - 1 & 0x3f));
      uVar3 = (uint)(-1L << ((byte)uVar1 & 0x3f));
      if ((uVar17 & 1) != 0) {
        uVar3 = uVar5;
      }
      piVar6->xmin = -(uVar17 & 1) & uVar5;
      piVar6->xmax = ~uVar3;
      piVar6->in_blklen = (uVar1 * uVar2 + iVar13 >> 3) + 0x10;
      pp_Var8 = (_func_int_aec_stream_ptr_conflict **)
                malloc((ulong)(0x100000000 << (sbyte)iVar13) >> 0x1d);
      piVar6->id_table = pp_Var8;
      if (pp_Var8 == (_func_int_aec_stream_ptr_conflict **)0x0) {
        iVar13 = -4;
      }
      else {
        *pp_Var8 = m_low_entropy;
        uVar18 = (ulong)((1 << (sbyte)iVar13) - 1);
        for (uVar9 = 1; uVar9 < uVar18; uVar9 = uVar9 + 1) {
          piVar6->id_table[uVar9] = m_split;
        }
        piVar6->id_table[uVar18] = m_uncomp;
        uVar9 = (ulong)(strm->rsi * uVar2);
        piVar6->rsi_size = uVar9;
        puVar10 = (uint32_t *)malloc(uVar9 << 2);
        piVar6->rsi_buffer = puVar10;
        iVar13 = -4;
        if (puVar10 != (uint32_t *)0x0) {
          uVar17 = uVar17 & 8;
          piVar6->pp = uVar17;
          piVar6->ref = uVar17 >> 3;
          piVar6->encoded_block_size = uVar2 + ((int)(uVar17 << 0x1c) >> 0x1f);
          strm->total_in = 0;
          strm->total_out = 0;
          piVar6->rsip = puVar10;
          piVar6->flush_start = puVar10;
          piVar6->bitp = 0;
          piVar6->fs = 0;
          piVar6->mode = m_id;
          piVar6->offsets = (vector_t *)0x0;
          iVar13 = 0;
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int aec_decode_init(struct aec_stream *strm)
{
    struct internal_state *state;
    int modi;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;
    memset(state, 0, sizeof(struct internal_state));

    create_se_table(state->se_table);

    strm->state = state;

    if (strm->bits_per_sample > 16) {
        state->id_len = 5;

        if (strm->bits_per_sample <= 24 && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_24;
            else
                state->flush_output = flush_lsb_24;
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_32;
            else
                state->flush_output = flush_lsb_32;
        }
        state->out_blklen = strm->block_size * state->bytes_per_sample;
    }
    else if (strm->bits_per_sample > 8) {
        state->bytes_per_sample = 2;
        state->id_len = 4;
        state->out_blklen = strm->block_size * 2;
        if (strm->flags & AEC_DATA_MSB)
            state->flush_output = flush_msb_16;
        else
            state->flush_output = flush_lsb_16;
    } else {
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }

        state->bytes_per_sample = 1;
        state->out_blklen = strm->block_size;
        state->flush_output = flush_8;
    }

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = (INT64_C(1) << (strm->bits_per_sample - 1)) - 1;
        state->xmin = ~state->xmax;
    } else {
        state->xmin = 0;
        state->xmax = (UINT64_C(1) << strm->bits_per_sample) - 1;
    }

    state->in_blklen = (strm->block_size * strm->bits_per_sample
                        + state->id_len) / 8 + 16;

    modi = 1UL << state->id_len;
    state->id_table = malloc(modi * sizeof(int (*)(struct aec_stream *)));
    if (state->id_table == NULL)
        return AEC_MEM_ERROR;

    state->id_table[0] = m_low_entropy;
    for (int i = 1; i < modi - 1; i++) {
        state->id_table[i] = m_split;
    }
    state->id_table[modi - 1] = m_uncomp;

    state->rsi_size = strm->rsi * strm->block_size;
    state->rsi_buffer = malloc(state->rsi_size * sizeof(uint32_t));
    if (state->rsi_buffer == NULL)
        return AEC_MEM_ERROR;

    state->pp = strm->flags & AEC_DATA_PREPROCESS;
    if (state->pp) {
        state->ref = 1;
        state->encoded_block_size = strm->block_size - 1;
    } else {
        state->ref = 0;
        state->encoded_block_size = strm->block_size;
    }
    strm->total_in = 0;
    strm->total_out = 0;

    state->rsip = state->rsi_buffer;
    state->flush_start = state->rsi_buffer;
    state->bitp = 0;
    state->fs = 0;
    state->mode = m_id;
    state->offsets = NULL;

    return AEC_OK;
}